

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.h
# Opt level: O0

_Rb_tree_node<std::pair<double,_long>_> * __thiscall
HighsNodeQueue::NodesetAllocator<std::_Rb_tree_node<std::pair<double,_long>_>_>::allocate
          (NodesetAllocator<std::_Rb_tree_node<std::pair<double,_long>_>_> *this,size_type n)

{
  undefined8 *puVar1;
  long in_RSI;
  long *in_RDI;
  Chunk *newChunk;
  _Rb_tree_node<std::pair<double,_long>_> *ptr;
  _Rb_tree_node<std::pair<double,_long>_> *local_20;
  _Rb_tree_node<std::pair<double,_long>_> *local_8;
  
  if (in_RSI == 1) {
    local_20 = *(_Rb_tree_node<std::pair<double,_long>_> **)*in_RDI;
    if (local_20 == (_Rb_tree_node<std::pair<double,_long>_> *)0x0) {
      local_20 = *(_Rb_tree_node<std::pair<double,_long>_> **)(*in_RDI + 8);
      if ((local_20 == (_Rb_tree_node<std::pair<double,_long>_> *)0x0) ||
         (*(ulong *)(*in_RDI + 0x10) < *(long *)(*in_RDI + 8) + 0x30U)) {
        puVar1 = (undefined8 *)operator_new(0x1000);
        *puVar1 = *(undefined8 *)(*in_RDI + 0x18);
        *(undefined8 **)(*in_RDI + 0x18) = puVar1;
        *(undefined8 **)(*in_RDI + 8) = puVar1 + 2;
        *(long *)(*in_RDI + 0x10) = *(long *)(*in_RDI + 8) + 0xff0;
        local_20 = *(_Rb_tree_node<std::pair<double,_long>_> **)(*in_RDI + 8);
        *(long *)(*in_RDI + 8) = *(long *)(*in_RDI + 8) + 0x30;
      }
      else {
        *(long *)(*in_RDI + 8) = *(long *)(*in_RDI + 8) + 0x30;
      }
    }
    else {
      *(undefined8 *)*in_RDI = **(undefined8 **)*in_RDI;
    }
    local_8 = local_20;
  }
  else {
    local_8 = (_Rb_tree_node<std::pair<double,_long>_> *)operator_new(in_RSI * 0x30);
  }
  return local_8;
}

Assistant:

T* allocate(size_type n) {
      if (n == 1) {
        T* ptr = reinterpret_cast<T*>(state->freeListHead);
        if (ptr) {
          state->freeListHead =
              reinterpret_cast<FreelistNode*>(state->freeListHead)->next;
        } else {
          ptr = reinterpret_cast<T*>(state->currChunkStart);
          if (!ptr || state->currChunkStart + sizeof(FreelistNode) >
                          state->currChunkEnd) {
            auto newChunk = new Chunk;
            newChunk->next = state->chunkListHead;
            state->chunkListHead = newChunk;
            state->currChunkStart = reinterpret_cast<char*>(&newChunk->storage);
            state->currChunkEnd =
                state->currChunkStart + sizeof(newChunk->storage);
            ptr = reinterpret_cast<T*>(state->currChunkStart);
            state->currChunkStart += sizeof(FreelistNode);
          } else {
            state->currChunkStart += sizeof(FreelistNode);
          }
        }
        return ptr;
      }

      return static_cast<T*>(::operator new(n * sizeof(T)));
    }